

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O1

uint32_t libtorrent::aux::peer_priority(endpoint *e1,endpoint *e2)

{
  sa_family_t sVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bad_address_cast bVar10;
  bool bVar11;
  uint32_t uVar12;
  bad_address_cast *pbVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  array<char,_4UL> buf;
  uint32_t unaff_retaddr;
  bytes_type b1;
  bytes_type b2;
  bad_address_cast local_68;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char cStack_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  uint uStack_50;
  undefined4 uStack_4c;
  bad_address_cast local_48;
  undefined1 auStack_40 [16];
  ulong local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pbVar13 = &local_68;
  sVar1 = (e1->impl_).data_.base.sa_family;
  if (sVar1 == 2) {
    local_68 = (bad_address_cast)((ulong)(e1->impl_).data_.v6.sin6_flowinfo << 0x20);
    cStack_60 = '\0';
    cStack_5f = '\0';
    cStack_5e = '\0';
    cStack_5d = '\0';
    cStack_5c = '\0';
    cStack_5b = '\0';
    cStack_5a = '\0';
    cStack_59 = '\0';
    cStack_58 = '\0';
    cStack_57 = '\0';
    cStack_56 = '\0';
    cStack_55 = '\0';
    cStack_54 = '\0';
    cStack_53 = '\0';
    cStack_52 = '\0';
    cStack_51 = '\0';
    uStack_50 = 0;
  }
  else {
    uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
    uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
    cStack_60 = (char)uVar4;
    cStack_5f = (char)((ulong)uVar4 >> 8);
    cStack_5e = (char)((ulong)uVar4 >> 0x10);
    cStack_5d = (char)((ulong)uVar4 >> 0x18);
    cStack_5c = (char)((ulong)uVar4 >> 0x20);
    cStack_5b = (char)((ulong)uVar4 >> 0x28);
    cStack_5a = (char)((ulong)uVar4 >> 0x30);
    cStack_59 = (char)((ulong)uVar4 >> 0x38);
    cStack_58 = (char)uVar5;
    cStack_57 = (char)((ulong)uVar5 >> 8);
    cStack_56 = (char)((ulong)uVar5 >> 0x10);
    cStack_55 = (char)((ulong)uVar5 >> 0x18);
    cStack_54 = (char)((ulong)uVar5 >> 0x20);
    cStack_53 = (char)((ulong)uVar5 >> 0x28);
    cStack_52 = (char)((ulong)uVar5 >> 0x30);
    cStack_51 = (char)((ulong)uVar5 >> 0x38);
    uStack_50 = (e1->impl_).data_.v6.sin6_scope_id;
    local_68 = (bad_address_cast)0x1;
  }
  uStack_4c = 0;
  local_48.super_bad_cast = (bad_cast)((e2->impl_).data_.base.sa_family != 2);
  if ((bool)local_48.super_bad_cast) {
    auStack_40 = *(undefined1 (*) [16])((long)&(e2->impl_).data_ + 8);
    local_30 = (ulong)(e2->impl_).data_.v6.sin6_scope_id;
    local_48._4_4_ = 0;
  }
  else {
    local_48._4_4_ = (e2->impl_).data_.v6.sin6_flowinfo;
    auStack_40 = (undefined1  [16])0x0;
    local_30 = 0;
  }
  local_48._1_3_ = 0;
  if (local_68._0_4_ == local_48._0_4_) {
    if (local_68._0_4_ == 1) {
      auVar17[0] = -(auStack_40[0] == cStack_60);
      auVar17[1] = -(auStack_40[1] == cStack_5f);
      auVar17[2] = -(auStack_40[2] == cStack_5e);
      auVar17[3] = -(auStack_40[3] == cStack_5d);
      auVar17[4] = -(auStack_40[4] == cStack_5c);
      auVar17[5] = -(auStack_40[5] == cStack_5b);
      auVar17[6] = -(auStack_40[6] == cStack_5a);
      auVar17[7] = -(auStack_40[7] == cStack_59);
      auVar17[8] = -(auStack_40[8] == cStack_58);
      auVar17[9] = -(auStack_40[9] == cStack_57);
      auVar17[10] = -(auStack_40[10] == cStack_56);
      auVar17[0xb] = -(auStack_40[0xb] == cStack_55);
      auVar17[0xc] = -(auStack_40[0xc] == cStack_54);
      auVar17[0xd] = -(auStack_40[0xd] == cStack_53);
      auVar17[0xe] = -(auStack_40[0xe] == cStack_52);
      auVar17[0xf] = -(auStack_40[0xf] == cStack_51);
      bVar11 = uStack_50 == local_30 &&
               (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar17[0xf] >> 7) << 0xf) == 0xffff;
    }
    else {
      bVar11 = local_68._4_4_ == local_48._4_4_;
    }
    if (bVar11) {
      uVar2 = (e1->impl_).data_.v4.sin_port;
      uVar3 = (e2->impl_).data_.v4.sin_port;
      if ((ushort)(uVar3 << 8 | uVar3 >> 8) < (ushort)(uVar2 << 8 | uVar2 >> 8)) {
        local_68 = *(bad_address_cast *)&(e1->impl_).data_;
        uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 0xc);
        uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
        cStack_58 = (char)((ulong)uVar5 >> 0x20);
        cStack_57 = (char)((ulong)uVar5 >> 0x28);
        cStack_56 = (char)((ulong)uVar5 >> 0x30);
        cStack_55 = (char)((ulong)uVar5 >> 0x38);
        cStack_54 = (char)uVar6;
        cStack_53 = (char)((ulong)uVar6 >> 8);
        cStack_52 = (char)((ulong)uVar6 >> 0x10);
        cStack_51 = (char)((ulong)uVar6 >> 0x18);
        uStack_50 = (uint)((ulong)uVar6 >> 0x20);
        cStack_60 = (char)uVar4;
        cStack_5f = (char)((ulong)uVar4 >> 8);
        cStack_5e = (char)((ulong)uVar4 >> 0x10);
        cStack_5d = (char)((ulong)uVar4 >> 0x18);
        cStack_5c = (char)((ulong)uVar4 >> 0x20);
        cStack_5b = (char)((ulong)uVar4 >> 0x28);
        cStack_5a = (char)((ulong)uVar4 >> 0x30);
        cStack_59 = (char)((ulong)uVar4 >> 0x38);
        uVar5 = *(undefined8 *)&(e2->impl_).data_;
        uVar7 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
             *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar8;
        *(undefined8 *)&(e1->impl_).data_ = uVar5;
        *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar7;
        *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
             CONCAT17(cStack_55,
                      CONCAT16(cStack_56,
                               CONCAT15(cStack_57,CONCAT14(cStack_58,(int)((ulong)uVar4 >> 0x20)))))
        ;
        *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar6;
        *(bad_address_cast *)&(e2->impl_).data_ = local_68;
        *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar4;
      }
      uVar2 = (e1->impl_).data_.v4.sin_port;
      iVar15 = 8;
      do {
        *(char *)pbVar13 = (char)((ushort)(uVar2 << 8 | uVar2 >> 8) >> ((byte)iVar15 & 0x1f));
        pbVar13 = (bad_address_cast *)((long)pbVar13 + 1);
        iVar15 = iVar15 + -8;
      } while (iVar15 != -8);
      uVar2 = (e2->impl_).data_.v4.sin_port;
      iVar15 = 8;
      do {
        *(char *)pbVar13 = (char)((ushort)(uVar2 << 8 | uVar2 >> 8) >> ((byte)iVar15 & 0x1f));
        pbVar13 = (bad_address_cast *)((long)pbVar13 + 1);
        iVar15 = iVar15 + -8;
      } while (iVar15 != -8);
      uVar12 = crc32c_32(unaff_retaddr);
      return uVar12;
    }
  }
  bVar11 = boost::asio::ip::detail::operator<(&e2->impl_,&e1->impl_);
  if (sVar1 == 2) {
    if (bVar11) {
      uVar4 = *(undefined8 *)&(e1->impl_).data_;
      uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
      uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 0xc);
      uVar7 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
      cStack_58 = (char)((ulong)uVar6 >> 0x20);
      cStack_57 = (char)((ulong)uVar6 >> 0x28);
      cStack_56 = (char)((ulong)uVar6 >> 0x30);
      cStack_55 = (char)((ulong)uVar6 >> 0x38);
      cStack_54 = (char)uVar7;
      cStack_53 = (char)((ulong)uVar7 >> 8);
      cStack_52 = (char)((ulong)uVar7 >> 0x10);
      cStack_51 = (char)((ulong)uVar7 >> 0x18);
      uStack_50 = (uint)((ulong)uVar7 >> 0x20);
      cStack_60 = (char)uVar5;
      cStack_5f = (char)((ulong)uVar5 >> 8);
      cStack_5e = (char)((ulong)uVar5 >> 0x10);
      cStack_5d = (char)((ulong)uVar5 >> 0x18);
      cStack_5c = (char)((ulong)uVar5 >> 0x20);
      cStack_5b = (char)((ulong)uVar5 >> 0x28);
      cStack_5a = (char)((ulong)uVar5 >> 0x30);
      cStack_59 = (char)((ulong)uVar5 >> 0x38);
      uVar6 = *(undefined8 *)&(e2->impl_).data_;
      uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
      uVar9 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
      *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
           *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
      *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar9;
      *(undefined8 *)&(e1->impl_).data_ = uVar6;
      *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar8;
      *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
           CONCAT17(cStack_55,
                    CONCAT16(cStack_56,
                             CONCAT15(cStack_57,CONCAT14(cStack_58,(int)((ulong)uVar5 >> 0x20)))));
      *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar7;
      *(undefined8 *)&(e2->impl_).data_ = uVar4;
      *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar5;
    }
    if ((e1->impl_).data_.base.sa_family != 2) {
      local_68 = (bad_address_cast)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
    }
    local_48._0_4_ = (e1->impl_).data_.v6.sin6_flowinfo;
    bVar10 = local_48;
    if ((e2->impl_).data_.base.sa_family != 2) {
      local_68 = (bad_address_cast)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
    }
    uVar12 = (e2->impl_).data_.v6.sin6_flowinfo;
    local_28 = CONCAT44(local_28._4_4_,uVar12);
    uVar4 = local_28;
    if (local_48._0_2_ == (short)uVar12) {
      local_48._2_1_ = SUB41((uint)local_48._0_4_ >> 0x10,0);
      local_28._2_1_ = (char)(uVar12 >> 0x10);
      lVar14 = (ulong)(local_48._2_1_ == local_28._2_1_ && local_48._0_2_ == (short)uVar12) + 1;
    }
    else {
      lVar14 = 0;
    }
    lVar16 = 0;
    local_48 = bVar10;
    local_28 = uVar4;
    do {
      auStack_40[lVar16 + -8] = auStack_40[lVar16 + -8] & peer_priority::v4mask[lVar14][lVar16];
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != 4);
    lVar16 = 0;
    do {
      *(byte *)((long)&local_28 + lVar16) =
           *(byte *)((long)&local_28 + lVar16) & peer_priority::v4mask[lVar14][lVar16];
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != 4);
    local_68._4_4_ = (undefined4)local_28;
    local_68._0_4_ = local_48._0_4_;
    iVar15 = 1;
  }
  else {
    if (bVar11) {
      uVar4 = *(undefined8 *)&(e1->impl_).data_;
      uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
      uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 0xc);
      uVar7 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
      cStack_58 = (char)((ulong)uVar6 >> 0x20);
      cStack_57 = (char)((ulong)uVar6 >> 0x28);
      cStack_56 = (char)((ulong)uVar6 >> 0x30);
      cStack_55 = (char)((ulong)uVar6 >> 0x38);
      cStack_54 = (char)uVar7;
      cStack_53 = (char)((ulong)uVar7 >> 8);
      cStack_52 = (char)((ulong)uVar7 >> 0x10);
      cStack_51 = (char)((ulong)uVar7 >> 0x18);
      uStack_50 = (uint)((ulong)uVar7 >> 0x20);
      cStack_60 = (char)uVar5;
      cStack_5f = (char)((ulong)uVar5 >> 8);
      cStack_5e = (char)((ulong)uVar5 >> 0x10);
      cStack_5d = (char)((ulong)uVar5 >> 0x18);
      cStack_5c = (char)((ulong)uVar5 >> 0x20);
      cStack_5b = (char)((ulong)uVar5 >> 0x28);
      cStack_5a = (char)((ulong)uVar5 >> 0x30);
      cStack_59 = (char)((ulong)uVar5 >> 0x38);
      uVar6 = *(undefined8 *)&(e2->impl_).data_;
      uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
      uVar9 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
      *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
           *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
      *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar9;
      *(undefined8 *)&(e1->impl_).data_ = uVar6;
      *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar8;
      *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
           CONCAT17(cStack_55,
                    CONCAT16(cStack_56,
                             CONCAT15(cStack_57,CONCAT14(cStack_58,(int)((ulong)uVar5 >> 0x20)))));
      *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar7;
      *(undefined8 *)&(e2->impl_).data_ = uVar4;
      *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar5;
    }
    if ((e1->impl_).data_.base.sa_family == 2) {
      local_68 = (bad_address_cast)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
    }
    local_48 = *(bad_address_cast *)((long)&(e1->impl_).data_ + 8);
    bVar10 = local_48;
    auStack_40._0_8_ = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
    if ((e2->impl_).data_.base.sa_family == 2) {
      local_68 = (bad_address_cast)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
    }
    uVar4 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
    local_28 = uVar4;
    uVar4 = local_28;
    uStack_20 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x10);
    if (local_48._0_4_ == (int)uVar4) {
      local_28._4_2_ = (short)((ulong)uVar4 >> 0x20);
      lVar14 = (ulong)(local_48._4_2_ == local_28._4_2_ && local_48._0_4_ == (int)uVar4) + 1;
    }
    else {
      lVar14 = 0;
    }
    lVar16 = 0;
    local_48 = bVar10;
    local_28 = uVar4;
    do {
      auStack_40[lVar16 + -8] = auStack_40[lVar16 + -8] & peer_priority::v6mask[lVar14][lVar16];
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != 8);
    lVar16 = 0;
    do {
      *(byte *)((long)&local_28 + lVar16) =
           *(byte *)((long)&local_28 + lVar16) & peer_priority::v6mask[lVar14][lVar16];
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != 8);
    local_68 = local_48;
    cStack_60 = auStack_40[0];
    cStack_5f = auStack_40[1];
    cStack_5e = auStack_40[2];
    cStack_5d = auStack_40[3];
    cStack_5c = auStack_40[4];
    cStack_5b = auStack_40[5];
    cStack_5a = auStack_40[6];
    cStack_59 = auStack_40[7];
    cStack_58 = (char)local_28;
    cStack_57 = (char)((ulong)local_28 >> 8);
    cStack_56 = (char)((ulong)local_28 >> 0x10);
    cStack_55 = (char)((ulong)local_28 >> 0x18);
    cStack_54 = (char)((ulong)local_28 >> 0x20);
    cStack_53 = (char)((ulong)local_28 >> 0x28);
    cStack_52 = (char)((ulong)local_28 >> 0x30);
    cStack_51 = (char)((ulong)local_28 >> 0x38);
    uStack_50 = (uint)uStack_20;
    uStack_4c = (undefined4)((ulong)uStack_20 >> 0x20);
    iVar15 = 4;
  }
  uVar12 = crc32c((uint64_t *)&local_68,iVar15);
  return uVar12;
}

Assistant:

std::uint32_t peer_priority(tcp::endpoint e1, tcp::endpoint e2)
	{
		TORRENT_ASSERT(aux::is_v4(e1) == aux::is_v4(e2));

		using std::swap;

		std::uint32_t ret;
		if (e1.address() == e2.address())
		{
			if (e1.port() > e2.port())
				swap(e1, e2);
			std::array<char, 4> buf;
			auto ptr = buf.data();
			aux::write_uint16(e1.port(), ptr);
			aux::write_uint16(e2.port(), ptr);
			std::uint32_t p;
			std::memcpy(&p, buf.data(), 4);
			ret = crc32c_32(p);
		}
		else if (aux::is_v6(e1))
		{
			static const std::uint8_t v6mask[][8] = {
				{ 0xff, 0xff, 0xff, 0xff, 0x55, 0x55, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v6::bytes_type b1 = e1.address().to_v6().to_bytes();
			address_v6::bytes_type b2 = e2.address().to_v6().to_bytes();
			int const mask = std::memcmp(b1.data(), b2.data(), 4) ? 0
				: std::memcmp(b1.data(), b2.data(), 6) ? 1 : 2;
			apply_mask(b1.data(), v6mask[mask], 8);
			apply_mask(b2.data(), v6mask[mask], 8);
			std::uint64_t addrbuf[4];
			std::memcpy(&addrbuf[0], b1.data(), 16);
			std::memcpy(&addrbuf[2], b2.data(), 16);
			ret = aux::crc32c(addrbuf, 4);
		}
		else
		{
			static const std::uint8_t v4mask[][4] = {
				{ 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v4::bytes_type b1 = e1.address().to_v4().to_bytes();
			address_v4::bytes_type b2 = e2.address().to_v4().to_bytes();
			int mask = std::memcmp(&b1[0], &b2[0], 2) ? 0
				: std::memcmp(&b1[0], &b2[0], 3) ? 1 : 2;
			apply_mask(&b1[0], v4mask[mask], 4);
			apply_mask(&b2[0], v4mask[mask], 4);
			std::uint64_t addrbuf;
			std::memcpy(&addrbuf, &b1[0], 4);
			std::memcpy(reinterpret_cast<char*>(&addrbuf) + 4, &b2[0], 4);
			ret = aux::crc32c(&addrbuf, 1);
		}

		return ret;
	}